

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O2

int yylex_init(yyscan_t *ptr_yy_globals)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  
  if (ptr_yy_globals == (yyscan_t *)0x0) {
    iVar1 = 0x16;
  }
  else {
    pvVar2 = calloc(1,0x90);
    *ptr_yy_globals = pvVar2;
    if (pvVar2 != (void *)0x0) {
      return 0;
    }
    iVar1 = 0xc;
  }
  piVar3 = __errno_location();
  *piVar3 = iVar1;
  return 1;
}

Assistant:

int yylex_init(yyscan_t* ptr_yy_globals)
{
    if (ptr_yy_globals == NULL){
        errno = EINVAL;
        return 1;
    }

    *ptr_yy_globals = (yyscan_t) yyalloc ( sizeof( struct yyguts_t ), NULL );

    if (*ptr_yy_globals == NULL){
        errno = ENOMEM;
        return 1;
    }

    /* By setting to 0xAA, we expose bugs in yy_init_globals. Leave at 0x00 for releases. */
    memset(*ptr_yy_globals,0x00,sizeof(struct yyguts_t));

    return yy_init_globals ( *ptr_yy_globals );
}